

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SockAddr.cpp
# Opt level: O0

void AGSSock::SockAddr_set_Address(SockAddr *sa,char *addr)

{
  uint uVar1;
  int iVar2;
  char *__name;
  char *__service;
  uint local_13c;
  addrinfo *local_110;
  addrinfo *result;
  addrinfo hint;
  string local_b8 [32];
  string local_98 [32];
  long local_78;
  size_t index;
  string service;
  allocator<char> local_39;
  string local_38 [8];
  string node;
  char *addr_local;
  SockAddr *sa_local;
  
  node.field_2._8_8_ = addr;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,addr,&local_39);
  std::allocator<char>::~allocator(&local_39);
  std::__cxx11::string::string((string *)&index);
  local_78 = std::__cxx11::string::find((char *)local_38,0x11dfd2);
  if (local_78 != -1) {
    std::__cxx11::string::substr((ulong)local_98,(ulong)local_38);
    std::__cxx11::string::operator=((string *)&index,local_98);
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::substr((ulong)local_b8,(ulong)local_38);
    std::__cxx11::string::operator=(local_38,local_b8);
    std::__cxx11::string::~string(local_b8);
  }
  if (((sa->super_sockaddr_storage).ss_family != 10) &&
     (local_78 = std::__cxx11::string::rfind((char)local_38,0x3a), local_78 != -1)) {
    std::__cxx11::string::substr((ulong)&hint.ai_next,(ulong)local_38);
    std::__cxx11::string::operator=((string *)&index,(string *)&hint.ai_next);
    std::__cxx11::string::~string((string *)&hint.ai_next);
    std::__cxx11::string::resize((ulong)local_38);
  }
  local_110 = (addrinfo *)0x0;
  memset(&result,0,0x30);
  uVar1 = std::__cxx11::string::empty();
  result._0_4_ = (uVar1 & 1) != 0 | 0x28;
  if ((sa->super_sockaddr_storage).ss_family == 0) {
    local_13c = 0;
  }
  else {
    local_13c = (uint)(sa->super_sockaddr_storage).ss_family;
  }
  result._4_4_ = local_13c;
  __name = (char *)std::__cxx11::string::c_str();
  __service = (char *)std::__cxx11::string::c_str();
  iVar2 = getaddrinfo(__name,__service,(addrinfo *)&result,&local_110);
  if ((iVar2 == 0) && (local_110 != (addrinfo *)0x0)) {
    memcpy(sa,local_110->ai_addr,(ulong)local_110->ai_addrlen);
    freeaddrinfo(local_110);
  }
  std::__cxx11::string::~string((string *)&index);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void SockAddr_set_Address(SockAddr *sa, const char *addr)
{
	std::string node = addr, service;
	size_t index;
	
	if ((index = node.find("://")) != std::string::npos)
	{
		service = node.substr(0, index);
		node = node.substr(index + 3);
	}
	
	if ((sa->ss_family != AF_INET6)
	&& ((index = node.rfind(':')) != std::string::npos))
	{
		service = node.substr(index + 1);
		node.resize(index);
	}
	
	addrinfo hint, *result = nullptr;
	memset(&hint, 0, sizeof (addrinfo));
	hint.ai_flags = AI_ADDRCONFIG | AI_V4MAPPED | (node.empty() ? AI_PASSIVE : 0);
	hint.ai_family = sa->ss_family ? sa->ss_family : AF_UNSPEC;
	
	if (getaddrinfo(node.c_str(), service.c_str(), &hint, &result) || !result)
	{
		// Handle error:
		// We'll simply do nothing when address resolving failed;
		// Users will figure out that the address object is empty,
		// so the address string supplied is most likely invalid.
		return;
	}

	memcpy(sa, result->ai_addr, result->ai_addrlen);
	freeaddrinfo(result);
}